

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O3

void __thiscall Quest_Context::KilledPlayer(Quest_Context *this)

{
  bool bVar1;
  ushort *puVar2;
  ushort uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  pVar4;
  key_type local_a8;
  string local_88;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if ((this->quest->quest->info).disabled == false) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"killedplayers","");
    bVar1 = EOPlus::Context::QueryRule(&this->super_Context,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"killedplayers","");
      puVar2 = (ushort *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->progress,&local_a8);
      uVar3 = *puVar2 + 1;
      *puVar2 = uVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      uVar3 = 0;
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"killedplayers","");
    local_48._8_8_ = 0;
    local_48._2_6_ = 0;
    local_48._0_2_ = uVar3;
    local_30 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1111:41)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1111:41)>
               ::_M_manager;
    bVar1 = EOPlus::Context::TriggerRule
                      (&this->super_Context,&local_88,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"killedplayers","");
      pVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
              ::equal_range(&(this->progress)._M_t,&local_a8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
      ::_M_erase_aux(&(this->progress)._M_t,(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void Quest_Context::KilledPlayer()
{
	if (this->quest->Disabled())
		return;

	bool check = this->QueryRule("killedplayers");
	short amount = 0;

	if (check)
		amount = ++this->progress["killedplayers"];

	if (this->TriggerRule("killedplayers", [amount](const std::deque<util::variant>& args) { return amount >= int(args[0]); }))
		this->progress.erase("killedplayers");
}